

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O1

bool QWindowSystemInterface::handleMouseEvent<QWindowSystemInterface::SynchronousDelivery>
               (QWindow *window,ulong timestamp,QPointingDevice *device,QPointF *local,
               QPointF *global,MouseButtons state,MouseButton button,Type type,
               KeyboardModifiers mods,MouseEventSource source)

{
  double dVar1;
  bool bVar2;
  double dVar3;
  ScaleAndOrigin SVar4;
  QPointF args_3;
  QPointF args_2;
  
  if ((int)type < 0xad) {
    bVar2 = false;
    if ((type - MouseButtonPress < 2) || (bVar2 = false, type != MouseButtonDblClick)) {
LAB_0032f1f5:
      SVar4 = QHighDpiScaling::scaleAndOrigin(window,(Point)ZEXT812(0));
      dVar3 = 1.0 / SVar4.factor;
      dVar1 = local->xp;
      args_2.yp = dVar3 * local->yp + 0.0;
      args_3 = QHighDpi::fromNativeGlobalPosition<QPointF,QWindow>(global,window);
      args_2.xp = dVar1 * dVar3 + 0.0;
      bVar2 = QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
              handleEvent<QWindowSystemInterfacePrivate::MouseEvent,QWindow*,unsigned_long,QPointF,QPointF,QFlags<Qt::MouseButton>,QFlags<Qt::KeyboardModifier>,Qt::MouseButton,QEvent::Type,Qt::MouseEventSource,bool,QPointingDevice_const*>
                        (window,timestamp,args_2,args_3,
                         (QFlags<Qt::MouseButton>)
                         state.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                         super_QFlagsStorage<Qt::MouseButton>.i,
                         (QFlags<Qt::KeyboardModifier>)
                         mods.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                         super_QFlagsStorage<Qt::KeyboardModifier>.i,button,type,source,bVar2,device
                        );
      return bVar2;
    }
  }
  else if (type - NonClientAreaMouseMove < 3) {
    bVar2 = true;
    goto LAB_0032f1f5;
  }
  return false;
}

Assistant:

QT_DEFINE_QPA_EVENT_HANDLER(bool, handleMouseEvent, QWindow *window, ulong timestamp, const QPointingDevice *device,
                            const QPointF &local, const QPointF &global, Qt::MouseButtons state,
                            Qt::MouseButton button, QEvent::Type type, Qt::KeyboardModifiers mods,
                            Qt::MouseEventSource source)
{

    bool isNonClientArea = {};

    switch (type) {
    case QEvent::MouseButtonDblClick:
    case QEvent::NonClientAreaMouseButtonDblClick:
        Q_ASSERT_X(false, "QWindowSystemInterface::handleMouseEvent",
               "QTBUG-71263: Native double clicks are not implemented.");
        return false;
    case QEvent::MouseMove:
    case QEvent::MouseButtonPress:
    case QEvent::MouseButtonRelease:
        isNonClientArea = false;
        break;
    case QEvent::NonClientAreaMouseMove:
    case QEvent::NonClientAreaMouseButtonPress:
    case QEvent::NonClientAreaMouseButtonRelease:
        isNonClientArea = true;
        break;
    default:
        Q_UNREACHABLE();
    }

    auto localPos = QHighDpi::fromNativeLocalPosition(local, window);
    auto globalPos = QHighDpi::fromNativeGlobalPosition(global, window);

    return handleWindowSystemEvent<QWindowSystemInterfacePrivate::MouseEvent, Delivery>(window,
        timestamp, localPos, globalPos, state, mods, button, type, source, isNonClientArea, device);
}